

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

bool __thiscall
ServerService::sendSegments
          (ServerService *this,byte *data,int socketFD,sockaddr_storage clientDetails,
          int recvWindowSize)

{
  double dVar1;
  undefined8 uVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  _Map_pointer pppSVar10;
  _Map_pointer pppSVar11;
  int iVar12;
  int iVar13;
  byte4 bVar14;
  byte *__buf;
  SendUnit *pSVar15;
  Congestion *this_00;
  long *plVar16;
  ostream *poVar17;
  Sliding *pSVar18;
  ServerSegment *rudp;
  byte *pbVar19;
  int *piVar20;
  char *pcVar21;
  long lVar22;
  _Elt_pointer ppSVar23;
  _Map_pointer pppSVar24;
  ulong uVar25;
  sockaddr_storage *psVar26;
  Sliding **ppSVar27;
  ServerService *this_01;
  sockaddr *psVar28;
  long lVar29;
  ulong uVar30;
  _Elt_pointer ppSVar31;
  _Map_pointer pppSVar32;
  ulong uVar33;
  byte bVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  timeval timeValue;
  fd_set readFDs;
  timespec start;
  sockaddr_storage in_stack_fffffffffffffcd8;
  byte4 local_29c;
  _Deque_base<Sliding_*,_std::allocator<Sliding_*>_> local_288;
  _Map_pointer local_238;
  _Map_pointer local_230;
  _Elt_pointer local_228;
  _Elt_pointer ppSStack_220;
  timeval local_218;
  SendUnit *local_208;
  ulong local_200;
  ulong local_1f8;
  int local_1ec;
  _Elt_pointer local_1e8;
  _Elt_pointer ppSStack_1e0;
  long local_1d0;
  ulong local_1c8;
  double local_1c0;
  fd_set local_1b8;
  sockaddr local_130 [8];
  Sliding *local_b0 [16];
  
  bVar34 = 0;
  pppSVar32 = (_Map_pointer)(ulong)(uint)socketFD;
  iVar12 = rand();
  __buf = (byte *)calloc(0x5c0,1);
  pSVar15 = (SendUnit *)operator_new(0x20);
  local_200 = (ulong)(uint)(iVar12 % 100);
  SendUnit::SendUnit(pSVar15,iVar12 % 100,data);
  this_00 = (Congestion *)operator_new(0x38);
  Congestion::Congestion(this_00,recvWindowSize);
  local_1b8.fds_bits[0xe] = 0;
  local_1b8.fds_bits[0xf] = 0;
  local_1b8.fds_bits[0xc] = 0;
  local_1b8.fds_bits[0xd] = 0;
  local_1b8.fds_bits[10] = 0;
  local_1b8.fds_bits[0xb] = 0;
  local_1b8.fds_bits[8] = 0;
  local_1b8.fds_bits[9] = 0;
  local_1b8.fds_bits[6] = 0;
  local_1b8.fds_bits[7] = 0;
  local_1b8.fds_bits[4] = 0;
  local_1b8.fds_bits[5] = 0;
  local_1b8.fds_bits[2] = 0;
  local_1b8.fds_bits[3] = 0;
  local_1b8.fds_bits[0] = 0;
  local_1b8.fds_bits[1] = 0;
  iVar12 = socketFD + 0x3f;
  if (-1 < socketFD) {
    iVar12 = socketFD;
  }
  local_1c8 = 1L << ((byte)socketFD & 0x3f);
  local_1d0 = (long)(iVar12 >> 6);
  local_1b8.fds_bits[local_1d0] = local_1b8.fds_bits[local_1d0] | local_1c8;
  local_218.tv_sec = 0;
  local_218.tv_usec = 50000;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_230 = pppSVar32;
  std::_Deque_base<Sliding_*,_std::allocator<Sliding_*>_>::_M_initialize_map(&local_288,0);
  pppSVar11 = local_288._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppSVar10 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
  ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_last;
  local_1e8 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppSStack_1e0 = local_288._M_impl.super__Deque_impl_data._M_start._M_first;
  pppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
  while (pppSVar24 < pppSVar11) {
    operator_delete(pppSVar24[1],0x200);
    pppSVar32 = pppSVar24 + 1;
    pppSVar24 = pppSVar32;
  }
  local_1ec = (int)local_230 + 1;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_last = ppSVar23;
  local_1c0 = (double)recvWindowSize;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_node = pppSVar10;
  local_29c = (byte4)local_200;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1e8;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_first = ppSStack_1e0;
  local_208 = pSVar15;
  local_1f8 = local_200;
  local_1e8 = (_Elt_pointer)(ulong)-local_29c;
  do {
    uVar35 = SUB84(local_1c0,0);
    uVar36 = (undefined4)((ulong)local_1c0 >> 0x20);
    dVar1 = this_00->cwnd;
    if (dVar1 <= local_1c0) {
      uVar35 = SUB84(dVar1,0);
      uVar36 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    iVar12 = (int)(double)CONCAT44(uVar36,uVar35);
    if (this_00->isSlowStart == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sending Packets in mode: Slow Start",0x23);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximum Packets that will be sent:",0x22);
      plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
      std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sending Packets in mode: Congestion Avoidance",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Maximum Packets that will be sent:",0x22);
      plVar16 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
      std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
    }
    std::ostream::put((char)plVar16);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"RetransmissionTime-Out: ",0x18);
    poVar17 = std::ostream::_M_insert<double>(this_00->RTO);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    pppSVar10 = local_288._M_impl.super__Deque_impl_data._M_finish._M_node;
    pppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
    ppSVar31 = local_288._M_impl.super__Deque_impl_data._M_start._M_first;
    ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_238 = pppSVar32;
    local_228 = local_288._M_impl.super__Deque_impl_data._M_start._M_last;
    pSVar15 = local_208;
    for (pppSVar32 = local_288._M_impl.super__Deque_impl_data._M_start._M_node; local_208 = pSVar15,
        pppSVar32 < pppSVar10; pppSVar32 = pppSVar32 + 1) {
      operator_delete(pppSVar32[1],0x200);
      pSVar15 = local_208;
    }
    local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = ppSVar23;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_first = ppSVar31;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_node = pppSVar24;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_last = local_228;
    uVar33 = local_1f8;
    if (iVar12 != 0) {
      bVar14 = (byte4)local_1f8;
      if ((ulong)(bVar14 - (int)local_200) < pSVar15->dataSize) {
        do {
          uVar3 = bVar14 + 0x5b0;
          __buf = SendUnit::getSendUnit(pSVar15,bVar14);
          psVar26 = &clientDetails;
          psVar28 = local_130;
          for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
            cVar4 = psVar26->__ss_padding[0];
            cVar5 = psVar26->__ss_padding[1];
            cVar6 = psVar26->__ss_padding[2];
            cVar7 = psVar26->__ss_padding[3];
            cVar8 = psVar26->__ss_padding[4];
            cVar9 = psVar26->__ss_padding[5];
            psVar28->sa_family = psVar26->ss_family;
            psVar28->sa_data[0] = cVar4;
            psVar28->sa_data[1] = cVar5;
            psVar28->sa_data[2] = cVar6;
            psVar28->sa_data[3] = cVar7;
            psVar28->sa_data[4] = cVar8;
            psVar28->sa_data[5] = cVar9;
            psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar34 * -0x10 + 8);
            psVar28 = (sockaddr *)(psVar28[-(ulong)bVar34].sa_data + 6);
          }
          sendto((int)local_230,__buf,0x5c0,0,local_130,0x80);
          pSVar18 = (Sliding *)operator_new(0x18);
          rudp = SendUnit::getRUDP(pSVar15,bVar14);
          clock_gettime(1,(timespec *)local_130);
          Sliding::Sliding(pSVar18,rudp,
                           (double)((long)local_130[0].sa_data._6_8_ / 1000000000 +
                                   local_130[0]._0_8_));
          local_b0[0] = pSVar18;
          if (local_288._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_288._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Sliding*,std::allocator<Sliding*>>::_M_push_back_aux<Sliding*>
                      ((deque<Sliding*,std::allocator<Sliding*>> *)&local_288,local_b0);
          }
          else {
            *local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar18;
            local_288._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_288._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          iVar12 = iVar12 + -1;
          uVar33 = (ulong)uVar3;
        } while ((iVar12 != 0) &&
                (bVar14 = uVar3, (ulong)((int)local_1e8 + uVar3) < pSVar15->dataSize));
      }
    }
    local_1f8 = uVar33;
    local_1b8.fds_bits[0] = 0;
    local_1b8.fds_bits[1] = 0;
    local_1b8.fds_bits[2] = 0;
    local_1b8.fds_bits[3] = 0;
    local_1b8.fds_bits[4] = 0;
    local_1b8.fds_bits[5] = 0;
    local_1b8.fds_bits[6] = 0;
    local_1b8.fds_bits[7] = 0;
    local_1b8.fds_bits[8] = 0;
    local_1b8.fds_bits[9] = 0;
    local_1b8.fds_bits[10] = 0;
    local_1b8.fds_bits[0xb] = 0;
    local_1b8.fds_bits[0xc] = 0;
    local_1b8.fds_bits[0xd] = 0;
    local_1b8.fds_bits[0xe] = 0;
    local_1b8.fds_bits[0xf] = 0;
    local_1b8.fds_bits[local_1d0] = local_1b8.fds_bits[local_1d0] | local_1c8;
    if ((local_218.tv_usec != 0) && (local_218.tv_sec != 0)) {
      local_218.tv_sec = (long)this_00->RTO / 1000000000;
      local_218.tv_usec = (__suseconds_t)(this_00->RTO * 1000.0 - (double)local_218.tv_sec);
    }
    iVar12 = (int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
             (int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
             ((((uint)((int)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (int)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (uint)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
             ) * 0x40;
    local_228 = (_Elt_pointer)0x0;
    pppSVar32 = local_238;
    do {
      while( true ) {
        while( true ) {
          iVar13 = select(local_1ec,&local_1b8,(fd_set *)0x0,(fd_set *)0x0,&local_218);
          if (iVar13 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error in Select",0xf);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            piVar20 = __errno_location();
            pcVar21 = strerror(*piVar20);
            poVar17 = std::operator<<((ostream *)&std::cerr,pcVar21);
            std::endl<char,std::char_traits<char>>(poVar17);
            exit(5);
          }
          if (0 < iVar13) break;
          if (iVar13 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Timeout Event ",0xe);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
            std::ostream::put('`');
            std::ostream::flush();
            if (local_218.tv_usec == 0 && local_218.tv_sec == 0) {
              uVar33 = ((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                       ((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                       ((((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                                 (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >>
                         3) - 1) +
                       (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                              (_Map_pointer)0x0)) * 0x40;
              if (uVar33 != 0) {
                psVar26 = &clientDetails;
                ppSVar27 = local_b0;
                for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
                  *ppSVar27 = *(Sliding **)psVar26;
                  psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar34 * -0x10 + 8);
                  ppSVar27 = ppSVar27 + (ulong)bVar34 * -2 + 1;
                }
                pbVar19 = SendUnit::getSendUnit(pSVar15,(byte4)pppSVar32);
                ppSVar27 = local_b0;
                psVar28 = local_130;
                for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
                  *(Sliding **)psVar28 = *ppSVar27;
                  ppSVar27 = ppSVar27 + (ulong)bVar34 * -2 + 1;
                  psVar28 = (sockaddr *)(psVar28[-(ulong)bVar34].sa_data + 6);
                }
                sendto((int)local_230,pbVar19,0x5c0,0,local_130,0x80);
                free(pbVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Retransmitting : ",0x11);
                poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
                std::ostream::put((char)poVar17);
                std::ostream::flush();
                pppSVar11 = local_288._M_impl.super__Deque_impl_data._M_finish._M_node;
                pppSVar10 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
                ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_last;
                local_228 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
                ppSStack_220 = local_288._M_impl.super__Deque_impl_data._M_start._M_first;
                pSVar15 = local_208;
                for (pppSVar24 = local_288._M_impl.super__Deque_impl_data._M_start._M_node;
                    local_238 = pppSVar32, local_208 = pSVar15, pppSVar24 < pppSVar11;
                    pppSVar24 = pppSVar24 + 1) {
                  operator_delete(pppSVar24[1],0x200);
                  pppSVar32 = local_238;
                  pSVar15 = local_208;
                }
                local_288._M_impl.super__Deque_impl_data._M_finish._M_last = ppSVar23;
                local_288._M_impl.super__Deque_impl_data._M_finish._M_node = pppSVar10;
                local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = local_228;
                local_288._M_impl.super__Deque_impl_data._M_finish._M_first = ppSStack_220;
                local_228 = (_Elt_pointer)uVar33;
              }
              Congestion::slowStart(this_00);
            }
            goto LAB_00103ec1;
          }
        }
        psVar26 = &clientDetails;
        this_01 = (ServerService *)&stack0xfffffffffffffcd8;
        for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
          uVar2._0_2_ = psVar26->ss_family;
          uVar2._2_1_ = psVar26->__ss_padding[0];
          uVar2._3_1_ = psVar26->__ss_padding[1];
          uVar2._4_1_ = psVar26->__ss_padding[2];
          uVar2._5_1_ = psVar26->__ss_padding[3];
          uVar2._6_1_ = psVar26->__ss_padding[4];
          uVar2._7_1_ = psVar26->__ss_padding[5];
          this_01->broadcastFD = (int)uVar2;
          this_01->serverPort = (int)((ulong)uVar2 >> 0x20);
          psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar34 * -0x10 + 8);
          this_01 = (ServerService *)((long)this_01 + (ulong)bVar34 * -0x10 + 8);
        }
        bVar14 = readAck(this_01,(int)local_230,in_stack_fffffffffffffcd8);
        pppSVar32 = (_Map_pointer)(ulong)bVar14;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ack Event ",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        if (local_29c < bVar14) break;
        this_00->dupAck = this_00->dupAck + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dup ACK: ",9);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," ACK Count:",0xb);
        plVar16 = (long *)std::ostream::operator<<(poVar17,this_00->dupAck);
        std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
        std::ostream::put((char)plVar16);
        std::ostream::flush();
        if (2 < this_00->dupAck) {
          psVar26 = &clientDetails;
          ppSVar27 = local_b0;
          for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
            *ppSVar27 = *(Sliding **)psVar26;
            psVar26 = (sockaddr_storage *)((long)psVar26 + (ulong)bVar34 * -0x10 + 8);
            ppSVar27 = ppSVar27 + (ulong)bVar34 * -2 + 1;
          }
          pbVar19 = SendUnit::getSendUnit(pSVar15,bVar14);
          ppSVar27 = local_b0;
          psVar28 = local_130;
          for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
            *(Sliding **)psVar28 = *ppSVar27;
            ppSVar27 = ppSVar27 + (ulong)bVar34 * -2 + 1;
            psVar28 = (sockaddr *)(psVar28[-(ulong)bVar34].sa_data + 6);
          }
          sendto((int)local_230,pbVar19,0x5c0,0,local_130,0x80);
          free(pbVar19);
          Congestion::updateRTO(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Retransmitting : ",0x11);
          poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
          std::ostream::put((char)poVar17);
          std::ostream::flush();
          lVar22 = ((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                   ((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                   ((((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                    - 1) + (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                  (_Map_pointer)0x0)) * 0x40;
          if (((lVar22 != 0) &&
              ((*local_288._M_impl.super__Deque_impl_data._M_start._M_cur)->mark == false)) &&
             (lVar22 = lVar22 + -1, lVar22 != 0)) {
            uVar25 = (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur -
                     (long)local_288._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
            lVar29 = 0;
            ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar33 = uVar25;
            do {
              if ((long)uVar33 < 0) {
                uVar30 = (long)uVar33 >> 6;
LAB_00103970:
                ppSVar31 = local_288._M_impl.super__Deque_impl_data._M_start._M_node[uVar30] +
                           uVar25 + lVar29 + uVar30 * -0x40;
              }
              else {
                ppSVar31 = ppSVar23;
                if (0x3f < uVar33) {
                  uVar30 = uVar33 >> 6;
                  goto LAB_00103970;
                }
              }
              (*ppSVar31)->mark = true;
              lVar29 = lVar29 + 1;
              ppSVar23 = ppSVar23 + 1;
              uVar33 = uVar33 + 1;
              lVar22 = lVar22 + -1;
            } while (lVar22 != 0);
          }
          Congestion::slowStart(this_00);
          this_00->dupAck = 0;
          local_228 = (_Elt_pointer)
                      (ulong)((int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_start.
                                                  _M_last -
                                           (long)local_288._M_impl.super__Deque_impl_data._M_start.
                                                 _M_cur) >> 3) +
                              (int)((ulong)((long)local_288._M_impl.super__Deque_impl_data._M_finish
                                                  ._M_cur -
                                           (long)local_288._M_impl.super__Deque_impl_data._M_finish.
                                                 _M_first) >> 3) +
                             ((((uint)((int)local_288._M_impl.super__Deque_impl_data._M_finish.
                                            _M_node -
                                      (int)local_288._M_impl.super__Deque_impl_data._M_start._M_node
                                      ) >> 3) - 1) +
                             (uint)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                   (_Map_pointer)0x0)) * 0x40);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"New ACK: ",9);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      lVar22 = (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
      lVar29 = (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
      ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)local_288._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
            (lVar22 + -1 +
            (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
            ) * 0x40 + lVar29 != 0) &&
          ((*local_288._M_impl.super__Deque_impl_data._M_start._M_cur)->seqNo <= bVar14 - 0x5b0)) &&
         (ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_finish._M_cur,
         local_288._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_288._M_impl.super__Deque_impl_data._M_start._M_cur)) {
        do {
          pSVar18 = *local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
          ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if ((bVar14 <= pSVar18->seqNo) || (pSVar18->mark != false)) break;
          local_238 = (_Map_pointer)pSVar18->sentTime;
          clock_gettime(1,(timespec *)local_130);
          Congestion::updateRTT
                    (this_00,(double)local_238,
                     (double)((long)local_130[0].sa_data._6_8_ / 1000000000 + local_130[0]._0_8_));
          if (local_288._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_288._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_288._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_288._M_impl.super__Deque_impl_data._M_start._M_last = ppSVar23 + 0x40;
            local_288._M_impl.super__Deque_impl_data._M_start._M_first = ppSVar23;
            local_288._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_288._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          local_288._M_impl.super__Deque_impl_data._M_start._M_cur = ppSVar23;
        } while (local_288._M_impl.super__Deque_impl_data._M_finish._M_cur != ppSVar23);
        lVar22 = (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_node -
                 (long)local_288._M_impl.super__Deque_impl_data._M_start._M_node >> 3;
        lVar29 = (long)ppSVar23 - (long)local_288._M_impl.super__Deque_impl_data._M_finish._M_first
                 >> 3;
        ppSVar23 = local_288._M_impl.super__Deque_impl_data._M_start._M_cur;
      }
      local_29c = bVar14;
    } while (((long)local_288._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppSVar23 >> 3)
             + (lVar22 + -1 +
               (ulong)(local_288._M_impl.super__Deque_impl_data._M_finish._M_node ==
                      (_Map_pointer)0x0)) * 0x40 + lVar29 != 0);
    dVar1 = this_00->ssthresh;
    if ((dVar1 <= this_00->cwnd) && ((dVar1 != -1.0 || (NAN(dVar1))))) {
      this_00->isSlowStart = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Entering Congestion Avoidance mode",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
    if (this_00->isSlowStart == true) {
      Congestion::updateSlowStart(this_00);
    }
    else {
      Congestion::updateCongestionAvoidance(this_00);
    }
    local_228 = (_Elt_pointer)0x0;
LAB_00103ec1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Percentage of Packets Sent: ",0x1c);
    iVar13 = iVar12 - (int)local_228;
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"/",1);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," = ",3);
    poVar17 = std::ostream::_M_insert<double>((double)(((float)iVar13 / (float)iVar12) * 100.0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((pSVar15->dataSize < (ulong)(uint)((int)local_1f8 - (int)local_200)) ||
       (pSVar15->dataSize < (ulong)(uint)((int)pppSVar32 - (int)local_200))) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      poVar17 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,"Last Packet has been delivered & All ACKs have been received",0x3c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      memset(__buf,0,0x5c0);
      operator_delete(pSVar15,0x20);
      std::_Deque_base<Sliding_*,_std::allocator<Sliding_*>_>::~_Deque_base(&local_288);
      return true;
    }
  } while( true );
}

Assistant:

bool
ServerService::sendSegments(byte *data, int socketFD, struct sockaddr_storage clientDetails, int recvWindowSize) {

    byte4 initSeqNo = rand() % 100;
    byte4 seqNo = initSeqNo;
    byte4 sendBase = initSeqNo;

    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    memset(buffer, 0, MTU);

    //使用序号获取 udp
    auto *sendUnit = new SendUnit(initSeqNo, data);

    auto *congestion = new Congestion(recvWindowSize);

    // 丢包数
    int packetDropped = 0;
    //数据分段数量
    int packetNumber = (int) (sendUnit->dataSize / (MTU - HEADER_LEN)) + 1;

    fd_set readFDs; // fd_set 来存储文件描述符, 用于使用多个套接字时不阻塞线程
    FD_ZERO(&readFDs); //FD_ZERO宏将一个 fd_set 类型变量的所有位都设为 0
    FD_SET(socketFD, &readFDs);
    int nextFD = socketFD + 1;

    byte4 ackNo;

    struct timeval timeValue;
    timeValue.tv_sec = 0; //秒
    timeValue.tv_usec = INIT_SEC; //微秒

    //双端队列实现滑动窗口
    deque<Sliding *> window;
    window.clear();
    int readyDescriptors; // -1 -> Error
    int sendDataNum; // 单次需要发送数据段数量
    int SlideWindowDataNum = 0;
    int left = 0;

    while (true) {
        sendDataNum = (int) min(congestion->cwnd, (double) recvWindowSize);
        if (congestion->isSlowStart) {
            cout << "Sending Packets in mode: Slow Start" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        } else {
            cout << "Sending Packets in mode: Congestion Avoidance" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        }

        cout << "RetransmissionTime-Out: " << congestion->RTO << endl;
        window.clear();

        //向滑动窗格填充数据
        while (sendDataNum != 0 && (seqNo - initSeqNo) < sendUnit->dataSize) {
            buffer = sendUnit->getSendUnit(seqNo);
            sendResponse(socketFD, buffer, clientDetails);
            window.push_back(new Sliding(sendUnit->getRUDP(seqNo), getTime()));
            seqNo += (MTU - HEADER_LEN);
            sendDataNum--;
        }
        //获取滑动窗格分组数
        SlideWindowDataNum = (int) window.size();

        FD_ZERO(&readFDs);
        FD_SET(socketFD, &readFDs);
        if (timeValue.tv_usec != 0 && timeValue.tv_sec != 0) {
            timeValue.tv_sec = (long) congestion->RTO / NANO_SEC;
            timeValue.tv_usec = (congestion->RTO) * 1000 - timeValue.tv_sec;
        }

        while (true) {
            readyDescriptors = select(nextFD, &readFDs, NULL, NULL, &timeValue);
            if (readyDescriptors == -1) {
                cout << "Error in Select" << endl;
                cerr << strerror(errno) << endl;
                exit(5);
            } else if (readyDescriptors > 0) {
                // ACK 判断
                ackNo = readAck(socketFD, clientDetails);
                cout << "Ack Event " << endl;
                if (sendBase < ackNo) {
                    // 创建新 ACK
                    cout << "New ACK: " << ackNo << endl;
                    sendBase = ackNo;
                    if (window.size() > 0 && sendBase - (MTU - HEADER_LEN) >= window.front()->seqNo) {
                        while (!window.empty()) {
                            if (window.front()->seqNo < sendBase && window.front()->mark == false) {
                                congestion->updateRTT(window.front()->sentTime, getTime());
                                window.pop_front();
                            } else {
                                break;
                            }
                        }
                    }
                    if (window.size() == 0) {
                        left = 0;
                        if (congestion->cwnd >= congestion->ssthresh && congestion->ssthresh != -1) {
                            congestion->isSlowStart = false; // congestion avoidance
                            cout << "Entering Congestion Avoidance mode" << endl;
                        }
                        if (congestion->isSlowStart) {
                            congestion->updateSlowStart();
                        } else {
                            congestion->updateCongestionAvoidance();
                        }
                        break;
                    }
                } else {
                    // 重复的 ACK 确认
                    congestion->dupAck++;
                    cout << "Dup ACK: " << ackNo << " ACK Count:" << congestion->dupAck << endl;
                    if (congestion->dupAck >= 3) {
                        // 三次收到重复 ACK 后立即重传
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        congestion->updateRTO();
                        packetDropped++;
                        cout << "Retransmitting : " << ackNo << endl;
                        if (window.size() != 0) {
                            if (!window.front()->mark) {
                                for (int i = 0; i < window.size() - 1; i++) {
                                    window[i]->mark = true;
                                }
                            }
                        }
                        congestion->slowStart();
                        congestion->dupAck = 0;
                        left = window.size();
                    }
                }
            } else if (readyDescriptors == 0) {
                // 超时
                cout << "Timeout Event " << endl;
                if (timeValue.tv_sec == 0 && timeValue.tv_usec == 0) {
                    // Loss occurred go back to slow start
                    packetDropped += window.size();
                    if (window.size() != 0) {
                        left = window.size();
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        cout << "Retransmitting : " << window.front()->seqNo << endl;
                        window.clear();
                    }
                    congestion->slowStart();
                }
                break;
            }
        }

        cout << "Percentage of Packets Sent: " << SlideWindowDataNum - left << "/" << SlideWindowDataNum << " = "
             << ((float) (SlideWindowDataNum - left) / SlideWindowDataNum) * 100 << endl;
        SlideWindowDataNum = 0, left = 0;
        if ((seqNo - initSeqNo) > sendUnit->dataSize || (ackNo - initSeqNo) > sendUnit->dataSize) {
            cout << endl << "Last Packet has been delivered & All ACKs have been received" << endl;
            break;
        }
    }

    memset(buffer, 0, MTU);
    delete sendUnit;
    return true;
}